

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O3

void __thiscall
Clone_resetWithVariable_Test::~Clone_resetWithVariable_Test(Clone_resetWithVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, resetWithVariable)
{
    auto r = libcellml::Reset::create();
    auto v = libcellml::Variable::create();

    r->setId("unique");
    r->setOrder(22);
    r->setVariable(v);

    auto rClone = r->clone();

    compareReset(r, rClone);
}